

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O0

string * __thiscall
chaiscript::exception::eval_error::format_location_abi_cxx11_
          (string *__return_storage_ptr__,eval_error *this,File_Position *t_where)

{
  ostream *poVar1;
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  eval_error *local_18;
  File_Position *t_where_local;
  
  local_18 = this;
  t_where_local = (File_Position *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"at (");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)local_18);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)&local_18->field_0x4);
  std::operator<<(poVar1,")");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

static std::string format_location(const File_Position &t_where) {
        std::stringstream ss;
        ss << "at (" << t_where.line << ", " << t_where.column << ")";
        return ss.str();
      }